

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkPairDetector.cpp
# Opt level: O3

void __thiscall
btGjkPairDetector::btGjkPairDetector
          (btGjkPairDetector *this,btConvexShape *objectA,btConvexShape *objectB,int shapeTypeA,
          int shapeTypeB,btScalar marginA,btScalar marginB,btVoronoiSimplexSolver *simplexSolver,
          btConvexPenetrationDepthSolver *penetrationDepthSolver)

{
  (this->super_btDiscreteCollisionDetectorInterface)._vptr_btDiscreteCollisionDetectorInterface =
       (_func_int **)&PTR__btDiscreteCollisionDetectorInterface_0021fc58;
  (this->m_cachedSeparatingAxis).m_floats[0] = 0.0;
  (this->m_cachedSeparatingAxis).m_floats[1] = 1.0;
  (this->m_cachedSeparatingAxis).m_floats[2] = 0.0;
  (this->m_cachedSeparatingAxis).m_floats[3] = 0.0;
  this->m_penetrationDepthSolver = penetrationDepthSolver;
  this->m_simplexSolver = simplexSolver;
  this->m_minkowskiA = objectA;
  this->m_minkowskiB = objectB;
  this->m_shapeTypeA = shapeTypeA;
  this->m_shapeTypeB = shapeTypeB;
  this->m_marginA = marginA;
  this->m_marginB = marginB;
  this->m_ignoreMargin = false;
  this->m_lastUsedMethod = -1;
  this->m_catchDegeneracies = 1;
  this->m_fixContactNormalDirection = 1;
  return;
}

Assistant:

btGjkPairDetector::btGjkPairDetector(const btConvexShape* objectA,const btConvexShape* objectB,int shapeTypeA,int shapeTypeB,btScalar marginA, btScalar marginB, btSimplexSolverInterface* simplexSolver,btConvexPenetrationDepthSolver*	penetrationDepthSolver)
:m_cachedSeparatingAxis(btScalar(0.),btScalar(1.),btScalar(0.)),
m_penetrationDepthSolver(penetrationDepthSolver),
m_simplexSolver(simplexSolver),
m_minkowskiA(objectA),
m_minkowskiB(objectB),
m_shapeTypeA(shapeTypeA),
m_shapeTypeB(shapeTypeB),
m_marginA(marginA),
m_marginB(marginB),
m_ignoreMargin(false),
m_lastUsedMethod(-1),
m_catchDegeneracies(1),
m_fixContactNormalDirection(1)
{
}